

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.C
# Opt level: O2

CmdLineArg * __thiscall
CmdLine::next(CmdLineArg *__return_storage_ptr__,CmdLine *this,int argc,char **argv)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *__s;
  int iVar4;
  size_t __n;
  char *pcVar5;
  CmdLineOption *pCVar6;
  char local_61;
  char *local_58;
  
  iVar3 = this->_idx;
  this->_idx = iVar3 + 1;
  if (argc <= iVar3 + 1) {
    __return_storage_ptr__->_what = '\0';
    __return_storage_ptr__->_name = (char *)0x0;
    __return_storage_ptr__->_opt = (char *)0x0;
    return __return_storage_ptr__;
  }
  pcVar5 = argv[(long)iVar3 + 1];
  if (*pcVar5 != '-') {
    __return_storage_ptr__->_what = '\x01';
    goto LAB_00106c4f;
  }
  cVar1 = pcVar5[1];
  if (cVar1 == '\0') {
LAB_00106b84:
    __return_storage_ptr__->_what = '\x02';
  }
  else {
    if (cVar1 == '-') {
      if (pcVar5[2] == '\0') goto LAB_00106b84;
      local_58 = pcVar5 + 2;
      local_61 = pcVar5[2];
    }
    else {
      local_58 = pcVar5 + 1;
      local_61 = cVar1;
    }
    for (pCVar6 = this->_opts; cVar2 = pCVar6->shortName, cVar2 != '\0'; pCVar6 = pCVar6 + 1) {
      if (cVar1 == '-') {
        __s = pCVar6->longName;
        if (__s != (char *)0x0) {
          __n = strlen(__s);
          iVar4 = strncmp(local_58,__s,__n);
          if ((iVar4 == 0) && ((local_58[__n] == '\0' || (local_58[__n] == '='))))
          goto LAB_00106c14;
        }
      }
      else if (local_61 == cVar2) {
        __n = 1;
LAB_00106c14:
        cVar1 = local_58[__n];
        if (pCVar6->flag != RequiredArgument) {
          if (cVar1 == '\0') {
            pcVar5 = pCVar6->longName;
            __return_storage_ptr__->_what = cVar2;
            goto LAB_00106c4f;
          }
          break;
        }
        if (cVar1 == '\0') {
          this->_idx = iVar3 + 2;
          if (argc <= iVar3 + 2) {
            __return_storage_ptr__->_what = '\x03';
            goto LAB_00106c4f;
          }
          pcVar5 = pCVar6->longName;
          local_58 = argv[(long)iVar3 + 2];
        }
        else {
          if (cVar1 != '=') break;
          local_58 = local_58 + __n + 1;
          pcVar5 = pCVar6->longName;
        }
        __return_storage_ptr__->_what = cVar2;
        __return_storage_ptr__->_name = pcVar5;
        __return_storage_ptr__->_opt = local_58;
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->_what = '\x02';
  }
LAB_00106c4f:
  __return_storage_ptr__->_name = pcVar5;
  __return_storage_ptr__->_opt = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

CmdLineArg const CmdLine::next(int argc, char * argv[])
{
    ++_idx;
    if (_idx >= argc) {
        return CmdLineArg();
    }

    char const * arg = argv[_idx];

    // Is it a command line argument?
    if (*arg != '-') {
        return CmdLineArg(CmdLineArg::NO_OPTION, argv[_idx]);
    }

    // Otherwise it is a short or long command line option
    bool longOpt = false;
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
    }
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
        longOpt = true;
    }

    // The rest shall be the command line option
    CmdLineOption const * opt = _opts;
    char const * end = nullptr;
    for (; opt->shortName != '\0'; ++opt) {
        if (longOpt) {
            if (opt->longName != nullptr && strncmp(arg, opt->longName, strlen(opt->longName)) == 0) {
                end = arg + strlen(opt->longName);
                // Shall end with '\0' or '='
                if (*end == '\0' || *end == '=') {
                    break;
                }
                // Otherwise keep looking for matches
                end = nullptr;
            }
        }
        else {
            if (*arg == opt->shortName) {
                end = arg + 1;
                break;
            }
        }
    }

    // Is it an invalid option
    if (opt->shortName == '\0' || end == nullptr) {
        return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
    }

    // Does it require arguments?
    if (opt->flag == CmdLineOption::RequiredArgument) {
        // Shall end with '=' or '\0'
        if (*end == '=') {
            ++end;
            return CmdLineArg(opt->shortName, opt->longName, end);
        }
        else if (*end == '\0') {
            // Argument is next
            ++_idx;
            if (_idx >= argc) {
                return CmdLineArg(CmdLineArg::REQUIRES_ARGUMENT, argv[_idx - 1]);
            }
            return CmdLineArg(opt->shortName, opt->longName, argv[_idx]);
        }
    }

    // Does not require arguments; end shall be '\0'
    if (*end == '\0') {
        return CmdLineArg(opt->shortName, opt->longName);
    }

    // Otherwise this is an invalid option
    return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
}